

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O3

void nn_bws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm_fn p_Var1;
  nn_list_item *it;
  
  if (*(int *)&self[1].fn == 2) {
    if (src != 1) {
      if (src == 2) {
        if (type == 0x85b9) {
          nn_list_erase((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x1b70));
          nn_aws_term((nn_aws *)srcptr);
          nn_free(srcptr);
          return;
        }
        if (type == 0x85b8) {
          nn_aws_stop((nn_aws *)srcptr);
          return;
        }
        if (type == 0x85b7) {
          p_Var1 = self[8].shutdown_fn;
          it = nn_list_end((nn_list *)&self[8].state);
          nn_list_insert((nn_list *)&self[8].state,(nn_list_item *)(p_Var1 + 0x1b70),it);
          self[8].shutdown_fn = (nn_fsm_fn)0x0;
          nn_bws_start_accepting((nn_bws *)self);
          return;
        }
        goto LAB_001a7464;
      }
      goto LAB_001a7455;
    }
    if (0xfffffffd < type - 9U) {
      return;
    }
LAB_001a745a:
    nn_bws_handler_cold_2();
  }
  else if (*(int *)&self[1].fn == 1) {
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
    }
    else {
      nn_bws_handler_cold_4();
    }
    nn_bws_handler_cold_5();
LAB_001a7455:
    nn_bws_handler_cold_3();
    goto LAB_001a745a;
  }
  nn_bws_handler_cold_6();
LAB_001a7464:
  nn_bws_handler_cold_1();
}

Assistant:

static void nn_bws_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bws *bws;
    struct nn_aws *aws;

    bws = nn_cont (self, struct nn_bws, fsm);

    switch (bws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BWS_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        bws->state = NN_BWS_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aws state machine in this state.          */
/******************************************************************************/
    case NN_BWS_STATE_ACTIVE:
        if (src == NN_BWS_SRC_USOCK) {
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child aws objects. */
        nn_assert (src == NN_BWS_SRC_AWS);
        aws = (struct nn_aws*) srcptr;
        switch (type) {
        case NN_AWS_ACCEPTED:

            /*  Move the newly created connection to the list of existing
                connections. */
            nn_list_insert (&bws->awss, &bws->aws->item,
                nn_list_end (&bws->awss));
            bws->aws = NULL;

            /*  Start waiting for a new incoming connection. */
            nn_bws_start_accepting (bws);
            return;

        case NN_AWS_ERROR:
            nn_aws_stop (aws);
            return;
        case NN_AWS_STOPPED:
            nn_list_erase (&bws->awss, &aws->item);
            nn_aws_term (aws);
            nn_free (aws);
            return;
        default:
            nn_fsm_bad_action (bws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bws->state, src, type);
    }
}